

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

vector<Pathie::Path,_std::allocator<Pathie::Path>_> * __thiscall
Pathie::Path::entries
          (vector<Pathie::Path,_std::allocator<Pathie::Path>_> *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  Path *__x;
  entry_iterator iter;
  entry_iterator local_50;
  entry_iterator local_38;
  
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  entry_iterator::entry_iterator(&local_50,this);
  while( true ) {
    entry_iterator::entry_iterator(&local_38);
    bVar1 = entry_iterator::operator!=(&local_50,&local_38);
    entry_iterator::~entry_iterator(&local_38);
    if (!bVar1) break;
    __x = entry_iterator::operator*(&local_50);
    std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back(__return_storage_ptr__,__x);
    entry_iterator::operator++(&local_50,0);
  }
  entry_iterator::~entry_iterator(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Path> Path::entries() const
{
  std::vector<Path> results;
  for(entry_iterator iter=begin_entries(); iter != end_entries(); iter++) {
    results.push_back(*iter);
  }

  return results;
}